

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O2

void __thiscall SslUdpSocketImpl::~SslUdpSocketImpl(SslUdpSocketImpl *this)

{
  (this->super_UdpSocketImpl).super_BaseSocketImpl._vptr_BaseSocketImpl =
       (_func_int **)&PTR__SslUdpSocketImpl_00144fc0;
  std::__cxx11::string::~string((string *)&this->m_strDestAddr);
  std::_Function_base::~_Function_base(&(this->m_fSllInitDoneParam).super__Function_base);
  std::_Function_base::~_Function_base(&(this->m_fSllInitDone).super__Function_base);
  std::
  unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>::
  ~unique_ptr(&this->m_pSslCon);
  OpenSSLWrapper::SslContext::~SslContext(&(this->m_pUdpCtx).super_SslContext);
  UdpSocketImpl::~UdpSocketImpl(&this->super_UdpSocketImpl);
  return;
}

Assistant:

SslUdpSocketImpl::~SslUdpSocketImpl()
{
}